

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# abcPart.c
# Opt level: O0

void Supp_ManRecycle(Supp_Man_t *p,char *pMemory,int nSize)

{
  int i;
  char *pNext;
  int Type;
  int nSize_local;
  char *pMemory_local;
  Supp_Man_t *p_local;
  
  i = Supp_SizeType(nSize,p->nStepSize);
  Vec_PtrFillExtra(p->vFree,i + 1,(void *)0x0);
  pNext = (char *)Vec_PtrEntry(p->vFree,i);
  Supp_OneSetNext(pMemory,pNext);
  Vec_PtrWriteEntry(p->vFree,i,pMemory);
  return;
}

Assistant:

void Supp_ManRecycle( Supp_Man_t * p, char * pMemory, int nSize )
{
    int Type;
    Type = Supp_SizeType( nSize, p->nStepSize );
    Vec_PtrFillExtra( p->vFree, Type + 1, NULL );
    Supp_OneSetNext( pMemory, (char *)Vec_PtrEntry(p->vFree, Type) );
    Vec_PtrWriteEntry( p->vFree, Type, pMemory );
}